

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

ON_String __thiscall ON_String::ToUTF8(ON_String *this)

{
  char *pcVar1;
  bool bVar2;
  ON_Internal_Empty_aString *pOVar3;
  ON_String *in_RSI;
  char *buffer;
  
  bVar2 = IsPossibleEncoding(in_RSI,UTF8);
  if (bVar2) {
    ON_String(this,in_RSI);
  }
  else {
    pcVar1 = in_RSI->m_s;
    pOVar3 = &empty_astring;
    if (pcVar1 != (char *)0x0) {
      pOVar3 = (ON_Internal_Empty_aString *)(pcVar1 + -0xc);
    }
    buffer = (char *)0x0;
    if (0 < (pOVar3->header).string_capacity) {
      buffer = pcVar1;
    }
    ToUTF8(this,buffer,(pOVar3->header).string_length);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ToUTF8() const
{
  if (IsPossibleEncoding(ON_String::Encoding::UTF8))
    return *this;
  return ON_String::ToUTF8( this->Array(), this->Length() );
}